

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayCommI.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::BaseFab<int>_>::ParallelCopy_nowait
          (FabArray<amrex::BaseFab<int>_> *this,FabArray<amrex::BaseFab<int>_> *src,int scomp,
          int dcomp,int ncomp,IntVect *snghost,IntVect *dnghost,Periodicity *period,CpOp op,
          CPC *a_cpc,bool to_ghost_cells_only)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  type this_00;
  size_type sVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  FabArrayBase *in_RSI;
  FabArrayBase *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  int *in_stack_00000008;
  Periodicity *in_stack_00000010;
  int in_stack_00000018;
  CPC *in_stack_00000020;
  byte in_stack_00000028;
  int N_locs;
  CPC *thecpc;
  int in_stack_000002dc;
  int in_stack_000002e0;
  int in_stack_000002e4;
  FabArray<amrex::BaseFab<int>_> *in_stack_000002e8;
  CPC *in_stack_000002f0;
  FabArray<amrex::BaseFab<int>_> *in_stack_000002f8;
  CpOp in_stack_000005a0;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  BoxArray *in_stack_fffffffffffffe50;
  byte local_169;
  IntVect local_150;
  IntVect local_144;
  FabArrayBase *local_138;
  BATType local_130;
  undefined1 local_124 [59];
  undefined4 in_stack_ffffffffffffff18;
  FabArrayBase *dstng;
  FabArrayBase *in_stack_ffffffffffffff38;
  FabArrayBase *local_b4;
  BATType local_ac;
  pointer local_a8;
  int local_a0;
  pointer local_94;
  int local_8c;
  undefined1 *local_88;
  FabArray<amrex::BaseFab<int>_> *local_80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  FabArray<amrex::BaseFab<int>_> *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  FabArray<amrex::BaseFab<int>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  local_124[0x33] = in_stack_00000028 & 1;
  dstng = in_RDI;
  iVar3 = FabArrayBase::size((FabArrayBase *)0x5c9af7);
  if ((iVar3 != 0) && (iVar3 = FabArrayBase::size((FabArrayBase *)0x5c9b09), iVar3 != 0)) {
    *(undefined8 *)(in_RDI->n_filled).vect = *(undefined8 *)in_stack_00000008;
    (in_RDI->n_filled).vect[2] = in_stack_00000008[2];
    FabArrayBase::boxArray(in_RSI);
    local_124._44_4_ =
         BoxArray::ixType((BoxArray *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
    ;
    iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    local_88 = local_124 + 0x2c;
    if ((local_124._44_4_ == 0) || (local_169 = 0, in_stack_00000018 == 0)) {
      bVar2 = BoxArray::operator==
                        (in_stack_fffffffffffffe50,
                         (BoxArray *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      local_169 = 0;
      if (bVar2) {
        bVar2 = DistributionMapping::operator==
                          ((DistributionMapping *)in_stack_fffffffffffffe50,
                           (DistributionMapping *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        local_169 = 0;
        if (bVar2) {
          unique0x100004f4 = in_R9;
          IntVect::IntVect((IntVect *)&local_94,0);
          iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
          local_a0 = local_8c;
          local_a8 = local_94;
          local_124._20_4_ = local_8c;
          local_124._12_8_ = local_94;
          local_124._32_8_ = local_94;
          uVar1 = local_124._32_8_;
          local_124._40_4_ = local_8c;
          local_124._32_4_ = SUB84(local_94,0);
          bVar2 = false;
          if (*(int *)in_R9 == local_124._32_4_) {
            local_124._36_4_ = (undefined4)((ulong)local_94 >> 0x20);
            bVar2 = false;
            if (*(int *)(in_R9 + 4) == local_124._36_4_) {
              bVar2 = *(int *)(in_R9 + 8) == local_8c;
            }
          }
          local_169 = 0;
          local_124._32_8_ = uVar1;
          in_R9 = stack0xffffffffffffff10;
          if (bVar2) {
            IntVect::IntVect((IntVect *)&stack0xffffffffffffff4c,0);
            local_130 = local_ac;
            local_138 = local_b4;
            local_124._0_8_ = local_b4;
            uVar1 = local_124._0_8_;
            local_124._8_4_ = local_ac;
            local_80 = (FabArray<amrex::BaseFab<int>_> *)local_124;
            in_stack_ffffffffffffffb4 = 0;
            local_124._0_4_ = SUB84(local_b4,0);
            bVar2 = false;
            if (*in_stack_00000008 == local_124._0_4_) {
              in_stack_ffffffffffffffa4 = 1;
              local_124._4_4_ = (undefined4)((ulong)local_b4 >> 0x20);
              bVar2 = false;
              in_stack_ffffffffffffffa8 = local_80;
              if (in_stack_00000008[1] == local_124._4_4_) {
                in_stack_ffffffffffffff94 = 2;
                bVar2 = in_stack_00000008[2] == local_ac;
                in_stack_ffffffffffffff98 = local_80;
              }
            }
            iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
            local_169 = 0;
            local_124._0_8_ = uVar1;
            in_R9 = stack0xffffffffffffff10;
            in_stack_ffffffffffffff38 = local_b4;
            if (bVar2) {
              bVar2 = Periodicity::isAnyPeriodic(in_stack_00000010);
              local_169 = 0;
              in_R9 = stack0xffffffffffffff10;
              in_stack_ffffffffffffff38 = local_b4;
              if (!bVar2) {
                local_169 = local_124[0x33] ^ 0xff;
              }
            }
          }
        }
      }
    }
    if ((local_169 & 1) == 0) {
      if (in_stack_00000020 == (CPC *)0x0) {
        in_stack_00000020 =
             FabArrayBase::getCPC
                       (in_stack_ffffffffffffff38,(IntVect *)dstng,in_RSI,
                        (IntVect *)CONCAT44(in_EDX,in_ECX),
                        (Periodicity *)CONCAT44(in_R8D,in_stack_ffffffffffffff18),
                        (bool)(char)((ulong)in_R9 >> 0x38));
      }
      iVar3 = ParallelContext::NProcsSub();
      if (iVar3 == 1) {
        this_00 = std::
                  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                  ::operator*((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                               *)in_stack_00000020);
        sVar4 = std::
                vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                ::size(this_00);
        if ((int)sVar4 != 0) {
          PC_local_cpu(in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,in_stack_000002e4,
                       in_stack_000002e0,in_stack_000002dc,in_stack_000005a0);
        }
      }
    }
    else if (in_RDI != in_RSI) {
      if (in_stack_00000018 == 0) {
        IntVect::IntVect(&local_144,0);
        Copy<amrex::BaseFab<int>,void>
                  ((FabArray<amrex::BaseFab<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                   iVar3,(IntVect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      else {
        IntVect::IntVect(&local_150,0);
        Add<amrex::BaseFab<int>,void>
                  ((FabArray<amrex::BaseFab<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                   iVar3,(IntVect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::ParallelCopy_nowait (const FabArray<FAB>& src,
                                    int                  scomp,
                                    int                  dcomp,
                                    int                  ncomp,
                                    const IntVect&       snghost,
                                    const IntVect&       dnghost,
                                    const Periodicity&   period,
                                    CpOp                 op,
                                    const FabArrayBase::CPC * a_cpc,
                                    bool                 to_ghost_cells_only)
{
    BL_PROFILE_SYNC_START_TIMED("SyncBeforeComms: PC");
    BL_PROFILE("FabArray::ParallelCopy_nowait()");

    AMREX_ASSERT_WITH_MESSAGE(!pcd, "ParallelCopy_nowait() called when comm operation already in progress.");

    if (size() == 0 || src.size() == 0) {
        return;
    }

    BL_ASSERT(op == FabArrayBase::COPY || op == FabArrayBase::ADD);
    BL_ASSERT(boxArray().ixType() == src.boxArray().ixType());
    BL_ASSERT(src.nGrowVect().allGE(snghost));
    BL_ASSERT(    nGrowVect().allGE(dnghost));

    n_filled = dnghost;

    if ((src.boxArray().ixType().cellCentered() || op == FabArrayBase::COPY) &&
        (boxarray == src.boxarray && distributionMap == src.distributionMap) &&
        snghost == IntVect::TheZeroVector() &&
        dnghost == IntVect::TheZeroVector() &&
        !period.isAnyPeriodic() && !to_ghost_cells_only)
    {
        //
        // Short-circuit full intersection code if we're doing copy()s or if
        // we're doing plus()s on cell-centered data.  Don't do plus()s on
        // non-cell-centered data this simplistic way.
        //
        if (this != &src) { // avoid self copy or plus
            if (op == FabArrayBase::COPY) {
                Copy(*this, src, scomp, dcomp, ncomp, IntVect(0));
            } else {
                Add(*this, src, scomp, dcomp, ncomp, IntVect(0));
            }
        }
        return;
    }

    const CPC& thecpc = (a_cpc) ? *a_cpc : getCPC(dnghost, src, snghost, period, to_ghost_cells_only);

    if (ParallelContext::NProcsSub() == 1)
    {
        //
        // There can only be local work to do.
        //

        int N_locs = (*thecpc.m_LocTags).size();
        if (N_locs == 0) { return; }
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            PC_local_gpu(thecpc, src, scomp, dcomp, ncomp, op);
        }
        else
#endif
        {
            PC_local_cpu(thecpc, src, scomp, dcomp, ncomp, op);
        }

        return;
    }

#ifdef BL_USE_MPI

    //
    // Do this before prematurely exiting if running in parallel.
    // Otherwise sequence numbers will not match across MPI processes.
    //
    int tag = ParallelDescriptor::SeqNum();

    const int N_snds = thecpc.m_SndTags->size();
    const int N_rcvs = thecpc.m_RcvTags->size();
    const int N_locs = thecpc.m_LocTags->size();

    if (N_locs == 0 && N_rcvs == 0 && N_snds == 0) {
        //
        // No work to do.
        //

        return;
    }

    //
    // Send/Recv at most MaxComp components at a time to cut down memory usage.
    //
    int NCompLeft = ncomp;
    int SC = scomp, DC = dcomp, NC;

    for (int ipass = 0; ipass < ncomp; )
    {
        pcd = std::make_unique<PCData<FAB>>();
        pcd->cpc = &thecpc;
        pcd->src = &src;
        pcd->op = op;
        pcd->tag = tag;

        NC = std::min(NCompLeft,FabArrayBase::MaxComp);
        const bool last_iter = (NCompLeft == NC);

        pcd->SC = SC;
        pcd->DC = DC;
        pcd->NC = NC;

        //
        // Post rcvs. Allocate one chunk of space to hold'm all.
        //
        pcd->the_recv_data = nullptr;

        pcd->actual_n_rcvs = 0;
        if (N_rcvs > 0) {
            PostRcvs(*thecpc.m_RcvTags, pcd->the_recv_data,
                     pcd->recv_data, pcd->recv_size, pcd->recv_from, pcd->recv_reqs, NC, pcd->tag);
            pcd->actual_n_rcvs = N_rcvs - std::count(pcd->recv_size.begin(), pcd->recv_size.end(), 0);
        }

        //
        // Post send's
        //
        Vector<char*>                       send_data;
        Vector<std::size_t>                 send_size;
        Vector<int>                         send_rank;
        Vector<const CopyComTagsContainer*> send_cctc;

        if (N_snds > 0)
        {
            src.PrepareSendBuffers(*thecpc.m_SndTags, pcd->the_send_data, send_data, send_size,
                                   send_rank, pcd->send_reqs, send_cctc, NC);

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion())
            {
                pack_send_buffer_gpu(src, SC, NC, send_data, send_size, send_cctc);
            }
            else
#endif
            {
                pack_send_buffer_cpu(src, SC, NC, send_data, send_size, send_cctc);
            }

            AMREX_ASSERT(pcd->send_reqs.size() == N_snds);
            FabArray<FAB>::PostSnds(send_data, send_size, send_rank, pcd->send_reqs, pcd->tag);
        }

        //
        // Do the local work.  Hope for a bit of communication/computation overlap.
        //
        if (N_locs > 0)
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion())
            {
                PC_local_gpu(thecpc, src, SC, DC, NC, op);
            }
            else
#endif
            {
                PC_local_cpu(thecpc, src, SC, DC, NC, op);
            }
        }

        if (!last_iter)
        {
            ParallelCopy_finish();

            SC += NC;
            DC += NC;
        }

        ipass     += NC;
        NCompLeft -= NC;
    }

#endif /*BL_USE_MPI*/
}